

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O1

void __thiscall cp::PlanFootprints::calcNextFootprintOld(PlanFootprints *this)

{
  undefined8 uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  Packet2d b_zw;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar14;
  undefined1 auVar12 [16];
  double dVar15;
  undefined1 auVar13 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar22;
  undefined1 auVar21 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  whichWalkOrStep(this);
  if (calcNextFootprintOld()::before_land_pos == '\0') {
    calcNextFootprintOld(this);
  }
  if (calcNextFootprintOld()::before_land_dis == '\0') {
    calcNextFootprintOld(this);
  }
  dVar16 = 0.0;
  dVar5 = 0.0;
  dVar4 = calcNextFootprintOld::before_land_pos.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  switch(*(undefined4 *)(this + 0x308)) {
  case 1:
    dVar16 = calcNextFootprintOld::before_land_pos.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
             + calcNextFootprintOld::before_land_pos.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] + (*(double *)(this + 0x2e8) -
                     calcNextFootprintOld::before_land_pos.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0]);
    dVar4 = *(double *)(this + 0x2f0);
    if (0.0 <= dVar4 || *(int *)(this + 0x2e0) != 0) {
      dVar5 = calcNextFootprintOld::before_land_dis.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      if (0.0 <= dVar4 && *(int *)(this + 0x2e0) == 1) {
        dVar5 = (double)(~-(ulong)(calcNextFootprintOld::before_land_dis.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1] < 0.0) & (ulong)dVar4);
      }
    }
    else {
      dVar5 = (double)(~-(ulong)(0.0 < calcNextFootprintOld::before_land_dis.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                       m_storage.m_data.array[1]) & (ulong)dVar4);
    }
  default:
    goto switchD_001091ea_caseD_2;
  case 5:
    break;
  case 6:
  case 7:
  case 9:
    dVar4 = *(double *)(this + 0x2f0);
    break;
  case 8:
    dVar16 = calcNextFootprintOld::before_land_pos.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    dVar5 = 0.0;
    if ((calcNextFootprintOld::before_land_pos.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] <
         0.0 && *(int *)(this + 0x2e0) == 0) ||
       (0.0 <= calcNextFootprintOld::before_land_pos.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1] && *(int *)(this + 0x2e0) == 1)) goto switchD_001091ea_caseD_2;
    goto LAB_001092d8;
  }
  dVar16 = *(double *)(this + 0x2e8);
  if ((dVar4 < 0.0 && *(int *)(this + 0x2e0) == 0) ||
     (dVar5 = 0.0, 0.0 <= dVar4 && *(int *)(this + 0x2e0) == 1)) {
LAB_001092d8:
    dVar5 = dVar4;
  }
switchD_001091ea_caseD_2:
  dVar4 = *(double *)(this + 0x300);
  dVar3 = cos(dVar4 * 0.5);
  dVar4 = sin(dVar4 * 0.5);
  dVar7 = dVar4 * 0.0;
  dVar17 = dVar4 * 0.0;
  dVar18 = dVar3 * 0.0;
  dVar8 = dVar7 * 0.0;
  auVar25._8_4_ = SUB84(dVar8 - dVar17,0);
  auVar25._0_8_ = dVar8 - dVar18;
  auVar25._12_4_ = (int)((ulong)(dVar8 - dVar17) >> 0x20);
  dVar20 = SUB168(auVar25 ^ _DAT_0010a050,0) + dVar7 + dVar17;
  dVar22 = SUB168(auVar25 ^ _DAT_0010a050,8) + dVar7 + dVar18;
  auVar11._8_4_ = SUB84(dVar8 + dVar17,0);
  auVar11._0_8_ = dVar8 + dVar18;
  auVar11._12_4_ = (int)((ulong)(dVar8 + dVar17) >> 0x20);
  dVar17 = SUB168(auVar11 ^ _DAT_0010a060,0) + (dVar4 - dVar8);
  dVar14 = SUB168(auVar11 ^ _DAT_0010a060,8) + (dVar3 - dVar8);
  dVar3 = *(double *)(this + 0x300) * 0.5 * 0.5;
  dVar4 = cos(dVar3);
  dVar3 = sin(dVar3);
  auVar11 = _DAT_0010a060;
  dVar7 = dVar3 * 0.0;
  dVar18 = dVar3 * 0.0;
  dVar19 = dVar4 * 0.0;
  dVar8 = dVar7 * 0.0;
  auVar12._8_4_ = SUB84(dVar8 - dVar18,0);
  auVar12._0_8_ = dVar8 - dVar19;
  auVar12._12_4_ = (int)((ulong)(dVar8 - dVar18) >> 0x20);
  auVar25 = ZEXT816(0x8000000000000000);
  dVar10 = SUB168(auVar12 ^ auVar25,0) + dVar7 + dVar18;
  dVar15 = SUB168(auVar12 ^ auVar25,8) + dVar7 + dVar19;
  auVar9._8_4_ = SUB84(dVar8 + dVar18,0);
  auVar9._0_8_ = dVar8 + dVar19;
  auVar9._12_4_ = (int)((ulong)(dVar8 + dVar18) >> 0x20);
  dVar18 = SUB168(auVar9 ^ _DAT_0010a060,0) + (dVar3 - dVar8);
  dVar19 = SUB168(auVar9 ^ _DAT_0010a060,8) + (dVar4 - dVar8);
  lVar2 = (ulong)*(uint *)(this + 0x2e0) * 0xe0;
  uVar1 = *(undefined8 *)(this + lVar2 + 800);
  dVar4 = *(double *)(this + lVar2 + 0x30);
  dVar3 = *(double *)(this + lVar2 + 0x38);
  dVar7 = *(double *)(this + lVar2 + 0x40);
  dVar8 = *(double *)(this + lVar2 + 0x48);
  dVar23 = dVar20 * dVar7 - dVar17 * dVar4;
  auVar24._8_4_ = SUB84(dVar23,0);
  auVar24._0_8_ = dVar22 * dVar7 - dVar14 * dVar4;
  auVar24._12_4_ = (int)((ulong)dVar23 >> 0x20);
  dVar23 = dVar4 * dVar20 + dVar7 * dVar17;
  auVar21._8_4_ = SUB84(dVar23,0);
  auVar21._0_8_ = dVar4 * dVar22 + dVar7 * dVar14;
  auVar21._12_4_ = (int)((ulong)dVar23 >> 0x20);
  auVar21 = auVar21 ^ _DAT_0010a060;
  *(double *)(this + lVar2 + 0x10) = *(double *)(this + lVar2 + 0x10) + dVar16;
  *(double *)(this + lVar2 + 0x10 + 8) = dVar5 + *(double *)(this + lVar2 + 0x18);
  *(undefined8 *)(this + lVar2 + 0x20) = uVar1;
  *(double *)(this + lVar2 + 0x30) = SUB168(auVar24 ^ auVar25,0) + dVar17 * dVar3 + dVar20 * dVar8;
  *(double *)(this + lVar2 + 0x30 + 8) =
       SUB168(auVar24 ^ auVar25,8) + dVar14 * dVar3 + dVar22 * dVar8;
  *(double *)(this + lVar2 + 0x40) = auVar21._0_8_ + (dVar8 * dVar17 - dVar3 * dVar20);
  *(double *)(this + lVar2 + 0x40 + 8) = auVar21._8_8_ + (dVar8 * dVar14 - dVar3 * dVar22);
  dVar4 = *(double *)(this + 0x2b0);
  dVar3 = *(double *)(this + 0x2b8);
  dVar7 = *(double *)(this + 0x2c0);
  dVar8 = *(double *)(this + 0x2c8);
  dVar17 = dVar10 * dVar7 - dVar18 * dVar4;
  auVar13._8_4_ = SUB84(dVar17,0);
  auVar13._0_8_ = dVar15 * dVar7 - dVar19 * dVar4;
  auVar13._12_4_ = (int)((ulong)dVar17 >> 0x20);
  dVar17 = dVar4 * dVar10 + dVar7 * dVar18;
  auVar6._8_4_ = SUB84(dVar17,0);
  auVar6._0_8_ = dVar4 * dVar15 + dVar7 * dVar19;
  auVar6._12_4_ = (int)((ulong)dVar17 >> 0x20);
  *(double *)(this + 0x2b0) = SUB168(auVar13 ^ auVar25,0) + dVar18 * dVar3 + dVar10 * dVar8;
  *(double *)(this + 0x2b8) = SUB168(auVar13 ^ auVar25,8) + dVar19 * dVar3 + dVar15 * dVar8;
  *(double *)(this + 0x2c0) = SUB168(auVar6 ^ auVar11,0) + (dVar8 * dVar18 - dVar3 * dVar10);
  *(double *)(this + 0x2c8) = SUB168(auVar6 ^ auVar11,8) + (dVar8 * dVar19 - dVar3 * dVar15);
  calcNextFootprintOld::before_land_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[0] = *(double *)(this + 0x2e8);
  calcNextFootprintOld::before_land_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[1] = *(double *)(this + 0x2f0);
  calcNextFootprintOld::before_land_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[2] = *(double *)(this + 0x2f8);
  calcNextFootprintOld::before_land_dis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[0] = dVar16;
  calcNextFootprintOld::before_land_dis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[1] = dVar5;
  calcNextFootprintOld::before_land_dis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[2] = 0.0;
  return;
}

Assistant:

void PlanFootprints::calcNextFootprintOld() {
  whichWalkOrStep();
  static Vector3 before_land_pos(step_vector.x(), step_vector.y(), 0.0);
  static Vector3 before_land_dis(step_vector.x(), step_vector.y(), 0.0);

  // calc next step land position
  Vector3 next_land_distance(0.0, 0.0, 0.0);
  if (wstate == starting1 || wstate == starting2 || wstate == step2walk) {
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] = isCollisionLegs(step_vector.y()) ? step_vector.y() : 0.0;
  } else if (wstate == stop_next) {  // walking stop
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? before_land_pos.y() : 0.0;
  } else if (wstate == walk2step) {  // walk -> step
    next_land_distance[0] = before_land_pos.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? 0.0 : before_land_pos.y();
  } else if (wstate == walk) {
    next_land_distance[0] =
        before_land_pos.x() * 2 + (step_vector.x() - before_land_pos.x());
    next_land_distance[1] = isCollisionLegs(step_vector.y(), before_land_dis.y());
  } else {
    next_land_distance[0] = 0.0;
    next_land_distance[1] = 0.0;
  }

  // calc next step land rotation
  Quat foot_rot = rpy2q(0.0, 0.0, step_angle);
  Quat waist_rot = rpy2q(0.0, 0.0, step_angle * 0.5);

  // swing leg
  Vector3 swing_p(
      ref_land_pose[swingleg].p().x() + next_land_distance[0],
      ref_land_pose[swingleg].p().y() + next_land_distance[1],
      init_feet_pose[swingleg].p().z());
  Quat swing_q = ref_land_pose[swingleg].q() * foot_rot;

  // set next landing position
  ref_land_pose[swingleg].set(swing_p, swing_q);
  ref_waist_r = ref_waist_r * waist_rot;

  before_land_pos = step_vector;
  before_land_dis = next_land_distance;
}